

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::FreeColSingletonPS::FreeColSingletonPS
          (FreeColSingletonPS *this,SPxLPBase<double> *lp,SPxMainSM<double> *simplifier,int _j,
          int _i,double slackVal,shared_ptr<soplex::Tolerances> *tols)

{
  double dVar1;
  double dVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  uint uVar3;
  undefined8 local_68;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  PostStep::PostStep(&this->super_PostStep,"FreeColSingleton",
                     (shared_ptr<soplex::Tolerances> *)&local_40,
                     (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,
                     (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeColSingletonPS_00334248;
  this->m_j = _j;
  this->m_i = _i;
  this->m_old_j = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  this->m_old_i = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  this->m_obj = -(lp->super_LPColSetBase<double>).object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[_j];
  this->m_lRhs = slackVal;
  dVar1 = (lp->super_LPRowSetBase<double>).left.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[_i];
  dVar2 = PostStep::epsilon(&this->super_PostStep);
  this->m_onLhs = ABS(slackVal - dVar1) <= dVar2;
  dVar1 = (lp->super_LPRowSetBase<double>).left.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[_i];
  dVar2 = (lp->super_LPRowSetBase<double>).right.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[_i];
  (*(this->super_PostStep)._vptr_PostStep[7])(this);
  this->m_eqCons = ABS(dVar1 - dVar2) <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  DSVectorBase<double>::DSVectorBase<double>
            (&this->m_row,
             (SVectorBase<double> *)
             ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[_i].idx));
  dVar1 = this->m_lRhs;
  dVar2 = (lp->super_LPColSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[this->m_j];
  uVar3 = (uint)((ulong)dVar2 >> 0x20);
  if (lp->thesense == MINIMIZE) {
    uVar3 = uVar3 ^ 0x80000000;
  }
  local_68 = (double)CONCAT44(uVar3,SUB84(dVar2,0));
  dVar2 = SVectorBase<double>::operator[](&(this->m_row).super_SVectorBase<double>,this->m_j);
  (*(simplifier->super_SPxSimplifier<double>)._vptr_SPxSimplifier[0x11])
            (SUB84(dVar1 * (local_68 / dVar2),0),simplifier);
  return;
}

Assistant:

FreeColSingletonPS(const SPxLPBase<R>& lp, SPxMainSM& simplifier, int _j, int _i,
                         R slackVal, std::shared_ptr<Tolerances> tols)
         : PostStep("FreeColSingleton", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_i(_i)
         , m_old_j(lp.nCols() - 1)
         , m_old_i(lp.nRows() - 1)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_lRhs(slackVal)
         , m_onLhs(EQ(slackVal, lp.lhs(_i), this->epsilon()))
         , m_eqCons(EQ(lp.lhs(_i), lp.rhs(_i), this->epsilon()))
         , m_row(lp.rowVector(_i))
      {
         assert(m_row[m_j] != 0.0);
         simplifier.addObjoffset(m_lRhs * (lp.obj(m_j) / m_row[m_j]));
      }